

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O1

void __thiscall ConstantExpression::set(ConstantExpression *this,string *str)

{
  string *psVar1;
  byte bVar2;
  byte *pbVar3;
  char cVar4;
  
  psVar1 = &this->m_text;
  (this->m_text)._M_string_length = 0;
  *(this->m_text)._M_dataplus._M_p = '\0';
  std::__cxx11::string::reserve((ulong)psVar1);
  cVar4 = (char)psVar1;
  std::__cxx11::string::push_back(cVar4);
  if (str->_M_string_length != 0) {
    pbVar3 = (byte *)(str->_M_dataplus)._M_p;
    do {
      bVar2 = *pbVar3;
      if (0x21 < bVar2) {
        if (((bVar2 != 0x5c) && (bVar2 != 0x27)) && (bVar2 != 0x22)) goto switchD_00113f47_caseD_8;
        goto LAB_00113fb5;
      }
      switch(bVar2) {
      case 7:
        break;
      default:
switchD_00113f47_caseD_8:
        if ((byte)(bVar2 + 0x81) < 0xa1) {
          std::__cxx11::string::append((char *)psVar1);
          std::__cxx11::string::push_back(cVar4);
        }
        std::__cxx11::string::push_back(cVar4);
        goto LAB_00113fba;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
        break;
      case 0xd:
      }
LAB_00113fb5:
      std::__cxx11::string::append((char *)psVar1);
LAB_00113fba:
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)((str->_M_dataplus)._M_p + str->_M_string_length));
  }
  std::__cxx11::string::push_back(cVar4);
  this->m_isLiteral = true;
  return;
}

Assistant:

void set( const std::string& str )
	{
		m_text.clear();
		m_text.reserve(str.size() + 2);

		m_text += '\"';
		for( basic_string <char>::const_iterator i = str.begin(); i != str.end(); ++i)
		{
			switch(*i)
			{
				case '\"':	m_text += "\\\"";			break;
				case '\'':	m_text += "\\\'";			break;
				case '\r':	m_text += "\\r";			break;
				case '\n':	m_text += "\\n";			break;
				case '\t':	m_text += "\\t";			break;
				case '\v':	m_text += "\\v";			break;
				case '\a':	m_text += "\\a";			break;
				case '\\':	m_text += "\\\\";			break;
			
				default:
					{
						const char c = *i;

						if (c < 0x20 || c > 0x7e)
						{
							m_text += "\\x00";
							m_text += ToHex((c >> 4) & 0x0f);
							m_text += ToHex(c & 0x0f);
						}
						else
						{
							m_text += c;
						}
					}
					break;
			}
		}
		m_text += '\"';

		m_isLiteral = true;
	}